

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlXPathNodeSetMerge(void)

{
  int iVar1;
  int iVar2;
  xmlNodeSetPtr val;
  xmlNodeSetPtr val_00;
  xmlNodeSetPtr val_01;
  int local_34;
  int n_val2;
  xmlNodeSetPtr val2;
  int n_val1;
  xmlNodeSetPtr val1;
  xmlNodeSetPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (val2._4_4_ = 0; (int)val2._4_4_ < 1; val2._4_4_ = val2._4_4_ + 1) {
    for (local_34 = 0; local_34 < 1; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_xmlNodeSetPtr(val2._4_4_,0);
      val_00 = gen_xmlNodeSetPtr(local_34,1);
      val_01 = (xmlNodeSetPtr)xmlXPathNodeSetMerge(val,val_00);
      desret_xmlNodeSetPtr(val_01);
      call_tests = call_tests + 1;
      des_xmlNodeSetPtr(val2._4_4_,val,0);
      des_xmlNodeSetPtr(local_34,val_00,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNodeSetMerge",(ulong)(uint)(iVar2 - iVar1));
        ret_val._4_4_ = ret_val._4_4_ + 1;
        printf(" %d",(ulong)val2._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlXPathNodeSetMerge(void) {
    int test_ret = 0;

#if defined(LIBXML_XPATH_ENABLED)
    int mem_base;
    xmlNodeSetPtr ret_val;
    xmlNodeSetPtr val1; /* the first NodeSet or NULL */
    int n_val1;
    xmlNodeSetPtr val2; /* the second NodeSet */
    int n_val2;

    for (n_val1 = 0;n_val1 < gen_nb_xmlNodeSetPtr;n_val1++) {
    for (n_val2 = 0;n_val2 < gen_nb_xmlNodeSetPtr;n_val2++) {
        mem_base = xmlMemBlocks();
        val1 = gen_xmlNodeSetPtr(n_val1, 0);
        val2 = gen_xmlNodeSetPtr(n_val2, 1);

        ret_val = xmlXPathNodeSetMerge(val1, val2);
        desret_xmlNodeSetPtr(ret_val);
        call_tests++;
        des_xmlNodeSetPtr(n_val1, val1, 0);
        des_xmlNodeSetPtr(n_val2, val2, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlXPathNodeSetMerge",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_val1);
            printf(" %d", n_val2);
            printf("\n");
        }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}